

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outmetrics(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  tetgenbehavior *ptVar2;
  void **ppvVar3;
  ulong uVar4;
  double *pdVar5;
  void *pvVar6;
  int *piVar7;
  size_t sVar8;
  tetgenmesh *ptVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  memorypool *pmVar13;
  char outmtrfilename [1024];
  FILE *local_450;
  char local_438 [4];
  undefined1 auStack_434 [1028];
  
  uVar10 = this->sizeoftensor - this->useinsertradius;
  if (uVar10 != 0) {
    ptVar2 = this->b;
    if (out == (tetgenio *)0x0) {
      strcpy(local_438,ptVar2->outfilename);
      sVar8 = strlen(local_438);
      builtin_strncpy(local_438 + sVar8,".mtr",4);
      auStack_434[sVar8] = 0;
      if (ptVar2->quiet == 0) {
        printf("Writing %s.\n",local_438);
      }
      local_450 = fopen(local_438,"w");
      if (local_450 == (FILE *)0x0) goto LAB_0014d175;
      fprintf(local_450,"%ld  %d\n",this->points->items,(ulong)uVar10);
      pmVar13 = this->points;
    }
    else {
      if (ptVar2->quiet == 0) {
        puts("Writing metrics.");
      }
      out->numberofpointmtrs = uVar10;
      pmVar13 = this->points;
      uVar4 = (long)(int)uVar10 * pmVar13->items;
      local_450 = (FILE *)0x0;
      pdVar5 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
      out->pointmtrlist = pdVar5;
    }
    ppvVar3 = pmVar13->firstblock;
    pmVar13->pathblock = ppvVar3;
    pmVar13->pathitem =
         (void *)((long)ppvVar3 +
                 (((long)pmVar13->alignbytes + 8U) -
                 (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar13->alignbytes));
    pmVar13->pathitemsleft = pmVar13->itemsperblock;
    while (pvVar6 = memorypool::traverse(this->points), pvVar6 != (void *)0x0) {
      if ((*(uint *)((long)pvVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0xa00) {
        iVar11 = 0;
        do {
          if (out == (tetgenio *)0x0) {
            if (0 < (int)uVar10) {
              lVar12 = 0;
              do {
                fprintf(local_450," %-16.8e",
                        *(undefined8 *)((long)pvVar6 + (this->pointmtrindex + lVar12) * 8));
                lVar12 = lVar12 + 1;
              } while (uVar10 != (uint)lVar12);
            }
            fputc(10,local_450);
          }
          else if (0 < (int)uVar10) {
            iVar1 = this->pointmtrindex;
            pdVar5 = out->pointmtrlist;
            uVar4 = 0;
            do {
              pdVar5[(long)iVar11 + uVar4] = *(double *)((long)pvVar6 + uVar4 * 8 + (long)iVar1 * 8)
              ;
              uVar4 = uVar4 + 1;
            } while (uVar10 != uVar4);
            iVar11 = iVar11 + (int)uVar4;
          }
          do {
            pvVar6 = memorypool::traverse(this->points);
            if (pvVar6 == (void *)0x0) goto LAB_0014cf8c;
          } while ((*(uint *)((long)pvVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                   0xa00);
        } while( true );
      }
    }
LAB_0014cf8c:
    ptVar2 = this->b;
    if (out == (tetgenio *)0x0) {
      strcpy(local_438,ptVar2->outfilename);
      sVar8 = strlen(local_438);
      builtin_strncpy(local_438 + sVar8,".p2t",4);
      auStack_434[sVar8] = 0;
      if (ptVar2->quiet == 0) {
        printf("Writing %s.\n",local_438);
      }
      local_450 = fopen(local_438,"w");
      if (local_450 == (FILE *)0x0) {
LAB_0014d175:
        printf("File I/O Error:  Cannot create file %s.\n",local_438);
        puts("A self-intersection was detected. Program stopped.");
        puts("Hint: use -d option to detect all self-intersections.");
        exit(3);
      }
    }
    else {
      if (ptVar2->quiet == 0) {
        puts("Writing point-to-tet map.");
      }
      uVar4 = this->points->items;
      piVar7 = (int *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 << 2);
      out->point2tetlist = piVar7;
    }
    if (this->bgm != (tetgenmesh *)0x0) {
      indexelements(this->bgm);
    }
    uVar10 = 0;
    if (this->b->zeroindex == 0) {
      uVar10 = this->in->firstnumber;
    }
    pmVar13 = this->points;
    ppvVar3 = pmVar13->firstblock;
    pmVar13->pathblock = ppvVar3;
    pmVar13->pathitem =
         (void *)((long)ppvVar3 +
                 (((long)pmVar13->alignbytes + 8U) -
                 (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar13->alignbytes));
    pmVar13->pathitemsleft = pmVar13->itemsperblock;
    while (pvVar6 = memorypool::traverse(this->points), pvVar6 != (void *)0x0) {
      if ((*(uint *)((long)pvVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0xa00) {
        lVar12 = 0;
        do {
          ptVar9 = this->bgm;
          if (ptVar9 != (tetgenmesh *)0x0) {
            ptVar9 = (tetgenmesh *)0x18;
          }
          if (out == (tetgenio *)0x0) {
            fprintf(local_450,"%d  %d\n",(ulong)uVar10);
          }
          else {
            out->point2tetlist[lVar12] =
                 *(int *)((*(ulong *)((long)pvVar6 + (long)(&ptVar9->in + this->point2simindex)) &
                          0xfffffffffffffff0) + 0x50);
          }
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + 1;
          do {
            pvVar6 = memorypool::traverse(this->points);
            if (pvVar6 == (void *)0x0) goto LAB_0014d139;
          } while ((*(uint *)((long)pvVar6 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                   0xa00);
        } while( true );
      }
    }
LAB_0014d139:
    if (out == (tetgenio *)0x0) {
      fprintf(local_450,"# Generated by %s\n",this->b->commandline);
      fclose(local_450);
    }
  }
  return;
}

Assistant:

void tetgenmesh::outmetrics(tetgenio* out)
{
  FILE *outfile = NULL;
  char outmtrfilename[FILENAMESIZE];
  point ptloop;
  int mtrindex = 0;
  int i;
  int msize = (sizeoftensor - useinsertradius);
  if (msize == 0) {
    return;
  }

  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".mtr");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing metrics.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points, number of point metrices,
    fprintf(outfile, "%ld  %d\n", points->items, msize);
  } else {
    // Allocate space for 'pointmtrlist'.
    out->numberofpointmtrs = msize; 
    out->pointmtrlist = new REAL[points->items * msize];
    if (out->pointmtrlist == (REAL *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (out == (tetgenio *) NULL) {
      for (i = 0; i < msize; i++) {
        fprintf(outfile, " %-16.8e", ptloop[pointmtrindex + i]);
      }
      fprintf(outfile, "\n");
    } else {
      for (i = 0; i < msize; i++) {
        out->pointmtrlist[mtrindex++] = ptloop[pointmtrindex + i];
      }
    }
    ptloop = pointtraverse();
  }

  // Output the point-to-tet map.
  if (out == (tetgenio *) NULL) {
    strcpy(outmtrfilename, b->outfilename);
    strcat(outmtrfilename, ".p2t");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", outmtrfilename);
    } else {
      printf("Writing point-to-tet map.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(outmtrfilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", outmtrfilename);
      terminatetetgen(this, 3);
    }
    // Number of points,
    //fprintf(outfile, "%ld\n", points->items);
  } else {
    // Allocate space for 'point2tetlist'.
    out->point2tetlist = new int[points->items];
    if (out->point2tetlist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
  }

  // The list of tetrahedra must be indexed.
  if (bgm != NULL) {
    bgm->indexelements();
  }
  // Determine the first index (0 or 1).
  int firstindex = b->zeroindex ? 0 : in->firstnumber;
  int pointindex = firstindex;
  i = 0;

  triface parenttet;
  points->traversalinit();
  ptloop = pointtraverse();
  while (ptloop != (point) NULL) {
    if (bgm != NULL) {
	  bgm->decode(point2bgmtet(ptloop), parenttet);
	} else {
	  decode(point2tet(ptloop), parenttet);
	}
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%d  %d\n", pointindex, elemindex(parenttet.tet));
    } else {
      out->point2tetlist[i] = elemindex(parenttet.tet);
    }
	pointindex++;
	i++;
    ptloop = pointtraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}